

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

PaUtilZeroer * PaUtil_SelectZeroer(PaSampleFormat destinationFormat)

{
  PaSampleFormat destinationFormat_local;
  
  switch(destinationFormat & 0xffffffff7fffffff) {
  case 1:
    destinationFormat_local = (PaSampleFormat)paZeroers.Zero32;
    break;
  case 2:
    destinationFormat_local = (PaSampleFormat)paZeroers.Zero32;
    break;
  default:
    destinationFormat_local = 0;
    break;
  case 4:
    destinationFormat_local = (PaSampleFormat)paZeroers.Zero24;
    break;
  case 8:
    destinationFormat_local = (PaSampleFormat)paZeroers.Zero16;
    break;
  case 0x10:
    destinationFormat_local = (PaSampleFormat)paZeroers.Zero8;
    break;
  case 0x20:
    destinationFormat_local = (PaSampleFormat)paZeroers.ZeroU8;
  }
  return (PaUtilZeroer *)destinationFormat_local;
}

Assistant:

PaUtilZeroer* PaUtil_SelectZeroer( PaSampleFormat destinationFormat )
{
    switch( destinationFormat & ~paNonInterleaved ){
    case paFloat32:
        return paZeroers.Zero32;
    case paInt32:
        return paZeroers.Zero32;
    case paInt24:
        return paZeroers.Zero24;
    case paInt16:
        return paZeroers.Zero16;
    case paInt8:
        return paZeroers.Zero8;
    case paUInt8:
        return paZeroers.ZeroU8;
    default: return 0;
    }
}